

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::RunTests(cmCTestMultiProcessHandler *this)

{
  cmCTestTestHandler *this_00;
  int n;
  cmCTestMultiProcessHandler *this_local;
  
  CheckResume(this);
  if ((this->HasCycles & 1U) == 0) {
    this_00 = this->TestHandler;
    n = FindMaxIndex(this);
    cmCTestTestHandler::SetMaxIndex(this_00,n);
    uv_loop_init(&this->Loop);
    StartNextTests(this);
    uv_run(&this->Loop,UV_RUN_DEFAULT);
    uv_loop_close(&this->Loop);
    MarkFinished(this);
    UpdateCostData(this);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::RunTests()
{
  this->CheckResume();
  if (this->HasCycles) {
    return;
  }
#ifdef CMAKE_UV_SIGNAL_HACK
  cmUVSignalHackRAII hackRAII;
#endif
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());

  uv_loop_init(&this->Loop);
  this->StartNextTests();
  uv_run(&this->Loop, UV_RUN_DEFAULT);
  uv_loop_close(&this->Loop);

  this->MarkFinished();
  this->UpdateCostData();
}